

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O2

string * VersionString_abi_cxx11_(string *__return_storage_ptr__,int version)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  if (version != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(local_188,version >> 4);
    poVar1 = std::operator<<(poVar1,".");
    std::ostream::operator<<(poVar1,version & 0xf);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string VersionString(int version)
{
    std::stringstream ss;
    if (version)
        ss << (version >> 4) << "." << (version & 0xf);
    return ss.str();
}